

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connect_timeout.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  int iVar2;
  int x_01;
  long *plVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (argc < 3) {
    fwrite("Usage: amqp_connect_timeout host port [timeout_sec [timeout_usec=0]]\n",0x45,1,_stderr);
    iVar2 = 1;
  }
  else {
    if (argc == 3) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = (long *)malloc(0x10);
      iVar2 = atoi(argv[3]);
      *plVar3 = (long)iVar2;
      if ((uint)argc < 5) {
        lVar5 = 0;
      }
      else {
        iVar2 = atoi(argv[4]);
        lVar5 = (long)iVar2;
      }
      plVar3[1] = lVar5;
    }
    pcVar1 = argv[1];
    iVar2 = atoi(argv[2]);
    uVar4 = amqp_new_connection();
    lVar5 = amqp_tcp_socket_new(uVar4);
    if (lVar5 == 0) {
      die("creating TCP socket");
    }
    iVar2 = amqp_socket_open_noblock(lVar5,pcVar1,iVar2,plVar3);
    die_on_error(iVar2,"opening TCP socket");
    iVar2 = 0;
    amqp_login(&local_48,uVar4,"/",0,0x20000,0,0,"guest","guest");
    x.reply._0_8_ = uStack_40;
    x._0_8_ = local_48;
    x.reply.decoded = (void *)local_38;
    x._24_8_ = uStack_30;
    die_on_amqp_error(x,"Logging in");
    amqp_connection_close(&local_68,uVar4,200);
    x_00.reply._0_8_ = uStack_60;
    x_00._0_8_ = local_68;
    x_00.reply.decoded = (void *)local_58;
    x_00._24_8_ = uStack_50;
    die_on_amqp_error(x_00,"Closing connection");
    x_01 = amqp_destroy_connection(uVar4);
    die_on_error(x_01,"Ending connection");
    puts("Done");
  }
  return iVar2;
}

Assistant:

int main(int argc, char const *const *argv)
{
  char const *hostname;
  int port;
  amqp_socket_t *socket;
  amqp_connection_state_t conn;
  struct timeval *tv;

  if (argc < 3) {
    fprintf(stderr, "Usage: amqp_connect_timeout host port [timeout_sec [timeout_usec=0]]\n");
    return 1;
  }

  if (argc > 3) {
    tv = malloc(sizeof(struct timeval));

    tv->tv_sec = atoi(argv[3]);

    if (argc > 4 ) {
      tv->tv_usec = atoi(argv[4]);
    } else {
      tv->tv_usec = 0;
    }

  } else {
    tv = NULL;
  }


  hostname = argv[1];
  port = atoi(argv[2]);

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);

  if (!socket) {
    die("creating TCP socket");
  }

  die_on_error(amqp_socket_open_noblock(socket, hostname, port, tv), "opening TCP socket");

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"), "Logging in");

  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");

  printf ("Done\n");
  return 0;
}